

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_comparison.cpp
# Opt level: O2

void __thiscall
duckdb::TimeStampComparison::TimeStampComparison
          (TimeStampComparison *this,ClientContext *context,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var4;
  _Head_base<0UL,_duckdb::CastExpressionMatcher_*,_false> _Var5;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> _Var6;
  pointer pCVar7;
  pointer pCVar8;
  pointer pEVar9;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_40;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_38;
  LogicalTypeId local_29;
  _Head_base<0UL,_duckdb::CastExpressionMatcher_*,_false> local_28;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_20;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_027a18a0;
  this->context = context;
  make_uniq<duckdb::ComparisonExpressionMatcher>();
  pCVar7 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_20);
  pCVar7->policy = UNORDERED;
  local_40._M_head_impl._0_1_ = 0x19;
  make_uniq<duckdb::SpecificExpressionTypeMatcher,duckdb::ExpressionType>
            ((duckdb *)&local_28,(ExpressionType *)&local_40);
  _Var5._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (CastExpressionMatcher *)0x0;
  pCVar7 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_20);
  _Var1._M_head_impl =
       (pCVar7->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar7->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)_Var5._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_28._M_head_impl != (CastExpressionMatcher *)0x0) {
    (*((local_28._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::CastExpressionMatcher>();
  local_38._M_head_impl._0_1_ = 0xf;
  make_uniq<duckdb::TypeMatcherId,duckdb::LogicalTypeId>
            ((duckdb *)&local_40,(LogicalTypeId *)&local_38);
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ExpressionMatcher *)0x0;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_28);
  _Var2._M_head_impl =
       (pCVar8->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pCVar8->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_40._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::ExpressionMatcher>();
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_28);
  _Var4._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ExpressionMatcher *)0x0;
  _Var3._M_head_impl =
       (pCVar8->matcher).
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (pCVar8->matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
    if (local_40._M_head_impl != (ExpressionMatcher *)0x0) {
      (*(local_40._M_head_impl)->_vptr_ExpressionMatcher[1])();
    }
  }
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_28);
  pEVar9 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(&pCVar8->matcher);
  pEVar9->expr_class = BOUND_COLUMN_REF;
  local_38._M_head_impl._0_1_ = 0x13;
  make_uniq<duckdb::TypeMatcherId,duckdb::LogicalTypeId>
            ((duckdb *)&local_40,(LogicalTypeId *)&local_38);
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ExpressionMatcher *)0x0;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_28);
  pEVar9 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(&pCVar8->matcher);
  _Var2._M_head_impl =
       (pEVar9->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar9->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_40._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pCVar7 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_20);
  local_40._M_head_impl = &(local_28._M_head_impl)->super_ExpressionMatcher;
  local_28._M_head_impl = (CastExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar7->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_40);
  if (local_40._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::CastExpressionMatcher>();
  local_29 = DATE;
  make_uniq<duckdb::TypeMatcherId,duckdb::LogicalTypeId>((duckdb *)&local_38,&local_29);
  _Var3._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ExpressionMatcher *)0x0;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_40);
  _Var2._M_head_impl =
       (pCVar8->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pCVar8->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::FoldableConstantMatcher>();
  _Var4._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ExpressionMatcher *)0x0;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_40);
  _Var3._M_head_impl =
       (pCVar8->matcher).
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (pCVar8->matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_40);
  pEVar9 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(&pCVar8->matcher);
  pEVar9->expr_class = BOUND_CONSTANT;
  local_29 = VARCHAR;
  make_uniq<duckdb::TypeMatcherId,duckdb::LogicalTypeId>((duckdb *)&local_38,&local_29);
  _Var3._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ExpressionMatcher *)0x0;
  pCVar8 = unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::CastExpressionMatcher,_std::default_delete<duckdb::CastExpressionMatcher>,_true>
                         *)&local_40);
  pEVar9 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(&pCVar8->matcher);
  _Var2._M_head_impl =
       (pEVar9->type).
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pEVar9->type).super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var3._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pCVar7 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_20);
  local_38._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar7->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_38);
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  _Var6._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  _Var3._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var6._M_head_impl)->super_ExpressionMatcher;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_40._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  if (local_28._M_head_impl != (CastExpressionMatcher *)0x0) {
    (*((local_28._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_20._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_20._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

TimeStampComparison::TimeStampComparison(ClientContext &context, ExpressionRewriter &rewriter)
    : Rule(rewriter), context(context) {
	// match on a ComparisonExpression that is an Equality and has a VARCHAR and ENUM as its children
	auto op = make_uniq<ComparisonExpressionMatcher>();
	op->policy = SetMatcher::Policy::UNORDERED;
	// Enum requires expression to be root
	op->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::COMPARE_EQUAL);

	// one side is timestamp cast to date
	auto left = make_uniq<CastExpressionMatcher>();
	left->type = make_uniq<TypeMatcherId>(LogicalTypeId::DATE);
	left->matcher = make_uniq<ExpressionMatcher>();
	left->matcher->expr_class = ExpressionClass::BOUND_COLUMN_REF;
	left->matcher->type = make_uniq<TypeMatcherId>(LogicalTypeId::TIMESTAMP);
	op->matchers.push_back(std::move(left));

	// other side is varchar to date?
	auto right = make_uniq<CastExpressionMatcher>();
	right->type = make_uniq<TypeMatcherId>(LogicalTypeId::DATE);
	right->matcher = make_uniq<FoldableConstantMatcher>();
	right->matcher->expr_class = ExpressionClass::BOUND_CONSTANT;
	right->matcher->type = make_uniq<TypeMatcherId>(LogicalTypeId::VARCHAR);
	op->matchers.push_back(std::move(right));

	root = std::move(op);
}